

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzer.cpp
# Opt level: O2

void __thiscall OneWireAnalyzer::SetupResults(OneWireAnalyzer *this)

{
  OneWireAnalyzerResults *this_00;
  
  this_00 = (OneWireAnalyzerResults *)operator_new(0x20);
  OneWireAnalyzerResults::OneWireAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  std::auto_ptr<OneWireAnalyzerResults>::reset(&this->mResults,this_00);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void OneWireAnalyzer::SetupResults()
{
    mResults.reset( new OneWireAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mOneWireChannel );
}